

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_range.cc
# Opt level: O1

void re2c::UTF8addContinuous(RangeSuffix **root,rune l,rune h,uint32_t n)

{
  uint32_t uVar1;
  uint32_t uVar2;
  RangeSuffix *pRVar3;
  RangeSuffix *pRVar4;
  uint uVar5;
  uint32_t hcs [4];
  uint32_t lcs [4];
  RangeSuffix *local_60;
  uint32_t local_58 [4];
  uint32_t local_48 [6];
  
  utf8::rune_to_bytes(local_48,l);
  utf8::rune_to_bytes(local_58,h);
  if (n != 0) {
    uVar5 = 1;
    do {
      uVar1 = local_48[n - uVar5];
      uVar2 = local_58[n - uVar5];
      pRVar3 = *root;
      if (*root != (RangeSuffix *)0x0) {
        do {
          pRVar4 = pRVar3;
          if ((pRVar4->l == uVar1) && (pRVar4->h == uVar2)) goto LAB_00132806;
          pRVar3 = pRVar4->next;
        } while (pRVar4->next != (RangeSuffix *)0x0);
        root = &pRVar4->next;
      }
      pRVar4 = (RangeSuffix *)operator_new(0x18);
      pRVar4->l = uVar1;
      pRVar4->h = uVar2;
      pRVar4->next = (RangeSuffix *)0x0;
      pRVar4->child = (RangeSuffix *)0x0;
      local_60 = pRVar4;
      std::
      _Rb_tree<re2c::RangeSuffix*,re2c::RangeSuffix*,std::_Identity<re2c::RangeSuffix*>,std::less<re2c::RangeSuffix*>,std::allocator<re2c::RangeSuffix*>>
      ::_M_insert_unique<re2c::RangeSuffix*>
                ((_Rb_tree<re2c::RangeSuffix*,re2c::RangeSuffix*,std::_Identity<re2c::RangeSuffix*>,std::less<re2c::RangeSuffix*>,std::allocator<re2c::RangeSuffix*>>
                  *)RangeSuffix::freeList,&local_60);
      *root = pRVar4;
LAB_00132806:
      root = &pRVar4->child;
      uVar5 = uVar5 + 1;
    } while (uVar5 <= n);
  }
  return;
}

Assistant:

void UTF8addContinuous(RangeSuffix * & root, utf8::rune l, utf8::rune h, uint32_t n)
{
	uint32_t lcs[utf8::MAX_RUNE_LENGTH];
	uint32_t hcs[utf8::MAX_RUNE_LENGTH];
	utf8::rune_to_bytes(lcs, l);
	utf8::rune_to_bytes(hcs, h);

	RangeSuffix ** p = &root;
	for (uint32_t i = 1; i <= n; ++i)
	{
		const uint32_t lc = lcs[n - i];
		const uint32_t hc = hcs[n - i];
		for (;;)
		{
			if (*p == NULL)
			{
				*p = new RangeSuffix(lc, hc);
				p = &(*p)->child;
				break;
			}
			else if ((*p)->l == lc && (*p)->h == hc)
			{
				p = &(*p)->child;
				break;
			}
			else
				p = &(*p)->next;
		}
	}
}